

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclstubs.c
# Opt level: O3

Integer pnga_solve(Integer g_a,Integer g_b)

{
  pnga_error("ga_lu_solve:scalapack not interfaced",0);
  return 0;
}

Assistant:

Integer pnga_solve(Integer g_a, Integer g_b) {
#if HAVE_SCALAPACK
#   if ENABLE_F77
    Integer gai_solve_(Integer *g_a, Integer *g_b);
    return gai_solve_(&g_a, &g_b);
#   else
    pnga_error("ga_lu_solve:scalapack interfaced, need configure --enable-f77",0L);
    return FALSE;
#   endif
#else
    pnga_error("ga_lu_solve:scalapack not interfaced",0L);
    return FALSE;
#endif
}